

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cpp
# Opt level: O0

void BrotliWriteHuffmanTreeRepetitionsZeros
               (size_t repetitions,size_t *tree_size,uint8_t *tree,uint8_t *extra_bits_data)

{
  size_t start_00;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  size_t *in_RSI;
  ulong in_RDI;
  size_t start;
  size_t i;
  ulong local_28;
  ulong local_8;
  
  local_8 = in_RDI;
  if (in_RDI == 0xb) {
    in_RDX[*in_RSI] = '\0';
    in_RCX[*in_RSI] = '\0';
    *in_RSI = *in_RSI + 1;
    local_8 = 10;
  }
  if (local_8 < 3) {
    for (local_28 = 0; local_28 < local_8; local_28 = local_28 + 1) {
      in_RDX[*in_RSI] = '\0';
      in_RCX[*in_RSI] = '\0';
      *in_RSI = *in_RSI + 1;
    }
  }
  else {
    start_00 = *in_RSI;
    local_8 = local_8 - 3;
    while( true ) {
      in_RDX[*in_RSI] = '\x11';
      in_RCX[*in_RSI] = (byte)local_8 & 7;
      *in_RSI = *in_RSI + 1;
      if (local_8 >> 3 == 0) break;
      local_8 = (local_8 >> 3) - 1;
    }
    Reverse(in_RDX,start_00,*in_RSI);
    Reverse(in_RCX,start_00,*in_RSI);
  }
  return;
}

Assistant:

static void BrotliWriteHuffmanTreeRepetitionsZeros(
    size_t repetitions,
    size_t* tree_size,
    uint8_t* tree,
    uint8_t* extra_bits_data) {
  if (repetitions == 11) {
    tree[*tree_size] = 0;
    extra_bits_data[*tree_size] = 0;
    ++(*tree_size);
    --repetitions;
  }
  if (repetitions < 3) {
    size_t i;
    for (i = 0; i < repetitions; ++i) {
      tree[*tree_size] = 0;
      extra_bits_data[*tree_size] = 0;
      ++(*tree_size);
    }
  } else {
    size_t start = *tree_size;
    repetitions -= 3;
    while (BROTLI_TRUE) {
      tree[*tree_size] = BROTLI_REPEAT_ZERO_CODE_LENGTH;
      extra_bits_data[*tree_size] = repetitions & 0x7;
      ++(*tree_size);
      repetitions >>= 3;
      if (repetitions == 0) {
        break;
      }
      --repetitions;
    }
    Reverse(tree, start, *tree_size);
    Reverse(extra_bits_data, start, *tree_size);
  }
}